

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

int insertfunc(char *s,attr *a)

{
  Env *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  this = current;
  std::__cxx11::string::string((string *)&local_38,s,&local_39);
  bVar1 = Env::insertfunc(this,&local_38,a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (int)bVar1;
}

Assistant:

int insertfunc(const char *s, const struct attr *a) {
    return current->insertfunc(s, *a);
}